

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

void __thiscall VcprojGenerator::initManifestTool(VcprojGenerator *this)

{
  bool bVar1;
  long in_RDI;
  long in_FS_OFFSET;
  VCManifestTool *tool;
  ProString tmplt;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  ProKey *in_stack_ffffffffffffff00;
  QString *config;
  uint7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  ProKey *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  byte in_stack_ffffffffffffff1f;
  ProString *in_stack_ffffffffffffff20;
  uint5 in_stack_ffffffffffffff38;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_38,0xaa,0x30);
  ProKey::ProKey(in_stack_ffffffffffffff00,
                 (char *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  QMakeEvaluator::first
            ((QMakeEvaluator *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
             in_stack_ffffffffffffff10);
  ProKey::~ProKey((ProKey *)0x2956f4);
  bVar1 = ProString::operator==
                    (in_stack_ffffffffffffff20,
                     (char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  bVar4 = 0;
  bVar3 = 0;
  bVar2 = 0;
  if (bVar1) {
    in_stack_ffffffffffffff20 = *(ProString **)(in_RDI + 0xd8);
    QString::QString((QString *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                     (char *)(ulong)in_stack_ffffffffffffff38);
    bVar4 = 1;
    bVar1 = QMakeProject::isActiveConfig
                      ((QMakeProject *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08)
                       ,(QString *)in_stack_ffffffffffffff00,(bool)in_stack_fffffffffffffeff);
    if (!bVar1) {
      QString::QString((QString *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                       (char *)CONCAT17(bVar4,CONCAT16(bVar3,CONCAT15(bVar2,
                                                  in_stack_ffffffffffffff38))));
      bVar3 = 1;
      bVar1 = QMakeProject::isActiveConfig
                        ((QMakeProject *)
                         CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                         (QString *)in_stack_ffffffffffffff00,(bool)in_stack_fffffffffffffeff);
      in_stack_ffffffffffffff1f = 1;
      if (!bVar1) goto LAB_00295812;
    }
  }
  bVar1 = ProString::operator==
                    (in_stack_ffffffffffffff20,
                     (char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  in_stack_ffffffffffffff1f = 0;
  if (bVar1) {
    config = *(QString **)(in_RDI + 0xd8);
    QString::QString((QString *)(ulong)in_stack_ffffffffffffff08,
                     (char *)CONCAT17(bVar4,CONCAT16(bVar3,CONCAT15(bVar2,in_stack_ffffffffffffff38)
                                                    )));
    bVar2 = 1;
    bVar1 = QMakeProject::isActiveConfig
                      ((QMakeProject *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff08)
                       ,config,(bool)in_stack_fffffffffffffeff);
    in_stack_ffffffffffffff1f = bVar1 ^ 0xff;
  }
LAB_00295812:
  if ((bVar2 & 1) != 0) {
    QString::~QString((QString *)0x29582d);
  }
  if ((bVar3 & 1) != 0) {
    QString::~QString((QString *)0x295840);
  }
  if ((bVar4 & 1) != 0) {
    QString::~QString((QString *)0x295856);
  }
  if ((in_stack_ffffffffffffff1f & 1) != 0) {
    *(undefined4 *)(in_RDI + 0xbb0) = 0;
  }
  ProString::~ProString((ProString *)0x295879);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VcprojGenerator::initManifestTool()
{
    VCManifestTool &tool = vcProject.Configuration.manifestTool;
    const ProString tmplt = project->first("TEMPLATE");
    if ((tmplt == "vclib"
         && !project->isActiveConfig("embed_manifest_dll")
         && !project->isActiveConfig("static"))
        || (tmplt == "vcapp"
            && !project->isActiveConfig("embed_manifest_exe"))) {
        tool.EmbedManifest = _False;
    }
}